

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketMonitorTestCase.cpp
# Opt level: O2

void __thiscall
SuiteSocketMonitorTests::TestUnsignal_SocketDoesNotExist_WriteSocketErased::RunImpl
          (TestUnsignal_SocketDoesNotExist_WriteSocketErased *this)

{
  int iVar1;
  SocketMonitor monitor;
  
  FIX::SocketMonitor::SocketMonitor(&monitor,0);
  iVar1 = (int)&monitor;
  FIX::SocketMonitor::addRead(iVar1);
  FIX::SocketMonitor::addConnect(iVar1);
  FIX::SocketMonitor::signal(iVar1);
  FIX::SocketMonitor::unsignal(iVar1);
  FIX::socket_close(0x65);
  FIX::SocketMonitor::~SocketMonitor(&monitor);
  return;
}

Assistant:

TEST(Unsignal_SocketDoesNotExist_WriteSocketErased)
{
  SocketMonitor monitor;
  TestStrategy strategy;

  int socket = 101;
  monitor.addRead(socket);
  monitor.addConnect(socket);

  monitor.signal(socket);
  monitor.unsignal(socket);

  socket_close(socket);
}